

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameTitle.cpp
# Opt level: O2

void __thiscall GameTitle::wipeTitle(GameTitle *this,Screen *screen,int color1,int color2)

{
  string letter;
  string blank;
  allocator local_49;
  allocator local_48 [32];
  string local_28 [32];
  
  std::__cxx11::string::string(local_28," ",local_48);
  std::__cxx11::string::string((string *)local_48,"",&local_49);
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void GameTitle::wipeTitle(Screen &screen, int color1, int color2) {
    std::string blank = " ";
    std::string letter = "";

    // TODO: Write the rest of this function

}